

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validationinterface.cpp
# Opt level: O1

void __thiscall
ValidationSignals::BlockConnected
          (ValidationSignals *this,ChainstateRole role,shared_ptr<const_CBlock> *pblock,
          CBlockIndex *pindex)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  unique_ptr<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_> uVar2;
  bool bVar3;
  Logger *this_01;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  undefined8 *local_d8;
  undefined8 uStack_d0;
  code *local_c8;
  code *pcStack_c0;
  char *local_name;
  string local_a8;
  ChainstateRole local_88;
  element_type *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  uint256 local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  peVar1 = (pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_name = "BlockConnected";
  this_01 = LogInstance();
  bVar3 = BCLog::Logger::WillLogCategoryLevel(this_01,VALIDATION,Debug);
  if (bVar3) {
    CBlockHeader::GetHash
              (&local_58,
               &((pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                super_CBlockHeader);
    base_blob<256u>::ToString_abi_cxx11_(&local_a8,&local_58);
    logging_function._M_str = "BlockConnected";
    logging_function._M_len = 0xe;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp"
    ;
    source_file._M_len = 0x67;
    LogPrintFormatInternal<char_const*,std::__cxx11::string,int>
              (logging_function,source_file,0xda,VALIDATION,Debug,
               (ConstevalFormatString<3U>)0x826f5b,&local_name,&local_a8,&pindex->nHeight);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  uVar2._M_t.
  super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>.
  _M_t.
  super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
  .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl =
       (((this->m_internals)._M_t.
         super___uniq_ptr_impl<ValidationSignalsImpl,_std::default_delete<ValidationSignalsImpl>_>.
         _M_t.
         super__Tuple_impl<0UL,_ValidationSignalsImpl_*,_std::default_delete<ValidationSignalsImpl>_>
         .super__Head_base<0UL,_ValidationSignalsImpl_*,_false>._M_head_impl)->m_task_runner)._M_t;
  local_a8._M_dataplus._M_p = local_name;
  local_a8._M_string_length =
       (size_type)(pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_a8.field_2._M_allocated_capacity =
       (size_type)
       (pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.field_2._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.field_2._M_allocated_capacity)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_a8.field_2._M_allocated_capacity)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.field_2._M_allocated_capacity)->
      _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_a8.field_2._M_allocated_capacity)->_M_use_count + 1;
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  local_d8 = (undefined8 *)0x0;
  uStack_d0 = 0;
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  local_a8.field_2._8_8_ = pindex;
  local_88 = role;
  local_80 = peVar1;
  local_78 = this_00;
  local_70 = pindex;
  uStack_68 = this;
  local_d8 = (undefined8 *)operator_new(0x48);
  *local_d8 = local_a8._M_dataplus._M_p;
  local_d8[1] = local_a8._M_string_length;
  local_d8[2] = local_a8.field_2._M_allocated_capacity;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.field_2._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_a8.field_2._M_allocated_capacity + 8) =
           *(_Atomic_word *)(local_a8.field_2._M_allocated_capacity + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_a8.field_2._M_allocated_capacity + 8) =
           *(_Atomic_word *)(local_a8.field_2._M_allocated_capacity + 8) + 1;
    }
  }
  local_d8[3] = local_a8.field_2._8_8_;
  *(ChainstateRole *)(local_d8 + 4) = local_88;
  local_d8[5] = local_80;
  local_d8[6] = local_78;
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_78->_M_use_count = local_78->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_78->_M_use_count = local_78->_M_use_count + 1;
    }
  }
  *(undefined4 *)(local_d8 + 7) = (undefined4)local_70;
  *(undefined4 *)((long)local_d8 + 0x3c) = local_70._4_4_;
  *(undefined4 *)(local_d8 + 8) = (undefined4)uStack_68;
  *(undefined4 *)((long)local_d8 + 0x44) = uStack_68._4_4_;
  pcStack_c0 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp:216:5)>
               ::_M_invoke;
  local_c8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validationinterface.cpp:216:5)>
             ::_M_manager;
  (**(code **)(*(long *)uVar2._M_t.
                        super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                        .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl +
              0x10))(uVar2._M_t.
                     super___uniq_ptr_impl<util::TaskRunnerInterface,_std::default_delete<util::TaskRunnerInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_util::TaskRunnerInterface_*,_std::default_delete<util::TaskRunnerInterface>_>
                     .super__Head_base<0UL,_util::TaskRunnerInterface_*,_false>._M_head_impl);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,3);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.field_2._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_a8.field_2._M_allocated_capacity);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ValidationSignals::BlockConnected(ChainstateRole role, const std::shared_ptr<const CBlock> &pblock, const CBlockIndex *pindex) {
    auto event = [role, pblock, pindex, this] {
        m_internals->Iterate([&](CValidationInterface& callbacks) { callbacks.BlockConnected(role, pblock, pindex); });
    };
    ENQUEUE_AND_LOG_EVENT(event, "%s: block hash=%s block height=%d", __func__,
                          pblock->GetHash().ToString(),
                          pindex->nHeight);
}